

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int EVP_EncodeBlock(uchar *t,uchar *f,int n)

{
  byte a;
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000014;
  size_t ret;
  size_t remaining;
  uint32_t l;
  size_t src_len_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  ret = CONCAT44(in_register_00000014,n);
  iVar3 = 0;
  src_len_local = (size_t)f;
  src_local = t;
  while (ret != 0) {
    if (ret < 3) {
      remaining._4_4_ = (uint)*(byte *)src_len_local << 0x10;
      if (ret == 2) {
        remaining._4_4_ = (uint)*(byte *)(src_len_local + 1) << 8 | remaining._4_4_;
      }
      uVar1 = conv_bin2ascii((uint8_t)(remaining._4_4_ >> 0x12));
      *src_local = uVar1;
      uVar1 = conv_bin2ascii((uint8_t)(remaining._4_4_ >> 0xc));
      src_local[1] = uVar1;
      if (ret == 1) {
        uVar1 = '=';
      }
      else {
        uVar1 = conv_bin2ascii((uint8_t)(remaining._4_4_ >> 6));
      }
      src_local[2] = uVar1;
      src_local[3] = '=';
      ret = 0;
    }
    else {
      uVar2 = (uint)*(byte *)src_len_local << 0x10 | (uint)*(byte *)(src_len_local + 1) << 8;
      a = *(byte *)(src_len_local + 2);
      uVar1 = conv_bin2ascii((uint8_t)(((uint)*(byte *)src_len_local << 0x10) >> 0x12));
      *src_local = uVar1;
      uVar1 = conv_bin2ascii((uint8_t)(uVar2 >> 0xc));
      src_local[1] = uVar1;
      uVar1 = conv_bin2ascii((uint8_t)((uVar2 | a) >> 6));
      src_local[2] = uVar1;
      uVar1 = conv_bin2ascii(a);
      src_local[3] = uVar1;
      ret = ret - 3;
    }
    src_local = src_local + 4;
    iVar3 = iVar3 + 4;
    src_len_local = src_len_local + 3;
  }
  *src_local = '\0';
  return iVar3;
}

Assistant:

size_t EVP_EncodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  uint32_t l;
  size_t remaining = src_len, ret = 0;

  while (remaining) {
    if (remaining >= 3) {
      l = (((uint32_t)src[0]) << 16L) | (((uint32_t)src[1]) << 8L) | src[2];
      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = conv_bin2ascii(l >> 6L);
      *(dst++) = conv_bin2ascii(l);
      remaining -= 3;
    } else {
      l = ((uint32_t)src[0]) << 16L;
      if (remaining == 2) {
        l |= ((uint32_t)src[1] << 8L);
      }

      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = (remaining == 1) ? '=' : conv_bin2ascii(l >> 6L);
      *(dst++) = '=';
      remaining = 0;
    }
    ret += 4;
    src += 3;
  }

  *dst = '\0';
  return ret;
}